

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parquet_types.cpp
# Opt level: O1

ssize_t __thiscall
duckdb_parquet::SizeStatistics::write(SizeStatistics *this,int __fd,void *__buf,size_t __n)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  undefined4 in_register_00000034;
  TProtocol *this_00;
  pointer plVar5;
  
  this_00 = (TProtocol *)CONCAT44(in_register_00000034,__fd);
  duckdb_apache::thrift::protocol::TProtocol::incrementOutputRecursionDepth(this_00);
  iVar1 = (*this_00->_vptr_TProtocol[4])(this_00,"SizeStatistics");
  if (((byte)this->__isset & 1) != 0) {
    iVar2 = (*this_00->_vptr_TProtocol[6])(this_00,"unencoded_byte_array_data_bytes",10,1);
    iVar3 = (*this_00->_vptr_TProtocol[0x13])(this_00,this->unencoded_byte_array_data_bytes);
    iVar4 = (*this_00->_vptr_TProtocol[7])(this_00);
    iVar1 = iVar3 + iVar4 + iVar2 + iVar1;
  }
  if (((byte)this->__isset & 2) != 0) {
    iVar2 = (*this_00->_vptr_TProtocol[6])(this_00,"repetition_level_histogram",0xf,2);
    iVar3 = (*this_00->_vptr_TProtocol[0xb])
                      (this_00,10,
                       (ulong)((long)(this->repetition_level_histogram).
                                     super_vector<long,_std::allocator<long>_>.
                                     super__Vector_base<long,_std::allocator<long>_>._M_impl.
                                     super__Vector_impl_data._M_finish -
                              (long)(this->repetition_level_histogram).
                                    super_vector<long,_std::allocator<long>_>.
                                    super__Vector_base<long,_std::allocator<long>_>._M_impl.
                                    super__Vector_impl_data._M_start) >> 3);
    iVar3 = iVar2 + iVar1 + iVar3;
    for (plVar5 = (this->repetition_level_histogram).super_vector<long,_std::allocator<long>_>.
                  super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
                  _M_start;
        plVar5 != (this->repetition_level_histogram).super_vector<long,_std::allocator<long>_>.
                  super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
                  _M_finish; plVar5 = plVar5 + 1) {
      iVar1 = (*this_00->_vptr_TProtocol[0x13])(this_00,*plVar5);
      iVar3 = iVar3 + iVar1;
    }
    iVar2 = (*this_00->_vptr_TProtocol[0xc])(this_00);
    iVar1 = (*this_00->_vptr_TProtocol[7])(this_00);
    iVar1 = iVar2 + iVar3 + iVar1;
  }
  if (((byte)this->__isset & 4) != 0) {
    iVar2 = (*this_00->_vptr_TProtocol[6])(this_00,"definition_level_histogram",0xf,3);
    iVar3 = (*this_00->_vptr_TProtocol[0xb])
                      (this_00,10,
                       (ulong)((long)(this->definition_level_histogram).
                                     super_vector<long,_std::allocator<long>_>.
                                     super__Vector_base<long,_std::allocator<long>_>._M_impl.
                                     super__Vector_impl_data._M_finish -
                              (long)(this->definition_level_histogram).
                                    super_vector<long,_std::allocator<long>_>.
                                    super__Vector_base<long,_std::allocator<long>_>._M_impl.
                                    super__Vector_impl_data._M_start) >> 3);
    iVar3 = iVar2 + iVar1 + iVar3;
    for (plVar5 = (this->definition_level_histogram).super_vector<long,_std::allocator<long>_>.
                  super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
                  _M_start;
        plVar5 != (this->definition_level_histogram).super_vector<long,_std::allocator<long>_>.
                  super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
                  _M_finish; plVar5 = plVar5 + 1) {
      iVar1 = (*this_00->_vptr_TProtocol[0x13])(this_00,*plVar5);
      iVar3 = iVar3 + iVar1;
    }
    iVar2 = (*this_00->_vptr_TProtocol[0xc])(this_00);
    iVar1 = (*this_00->_vptr_TProtocol[7])(this_00);
    iVar1 = iVar2 + iVar3 + iVar1;
  }
  iVar2 = (*this_00->_vptr_TProtocol[8])(this_00);
  iVar3 = (*this_00->_vptr_TProtocol[5])(this_00);
  this_00->output_recursion_depth_ = this_00->output_recursion_depth_ - 1;
  return (ulong)(uint)(iVar2 + iVar1 + iVar3);
}

Assistant:

uint32_t SizeStatistics::write(::apache::thrift::protocol::TProtocol* oprot) const {
  uint32_t xfer = 0;
  ::apache::thrift::protocol::TOutputRecursionTracker tracker(*oprot);
  xfer += oprot->writeStructBegin("SizeStatistics");

  if (this->__isset.unencoded_byte_array_data_bytes) {
    xfer += oprot->writeFieldBegin("unencoded_byte_array_data_bytes", ::apache::thrift::protocol::T_I64, 1);
    xfer += oprot->writeI64(this->unencoded_byte_array_data_bytes);
    xfer += oprot->writeFieldEnd();
  }
  if (this->__isset.repetition_level_histogram) {
    xfer += oprot->writeFieldBegin("repetition_level_histogram", ::apache::thrift::protocol::T_LIST, 2);
    {
      xfer += oprot->writeListBegin(::apache::thrift::protocol::T_I64, static_cast<uint32_t>(this->repetition_level_histogram.size()));
      duckdb::vector<int64_t> ::const_iterator _iter10;
      for (_iter10 = this->repetition_level_histogram.begin(); _iter10 != this->repetition_level_histogram.end(); ++_iter10)
      {
        xfer += oprot->writeI64((*_iter10));
      }
      xfer += oprot->writeListEnd();
    }
    xfer += oprot->writeFieldEnd();
  }
  if (this->__isset.definition_level_histogram) {
    xfer += oprot->writeFieldBegin("definition_level_histogram", ::apache::thrift::protocol::T_LIST, 3);
    {
      xfer += oprot->writeListBegin(::apache::thrift::protocol::T_I64, static_cast<uint32_t>(this->definition_level_histogram.size()));
      duckdb::vector<int64_t> ::const_iterator _iter11;
      for (_iter11 = this->definition_level_histogram.begin(); _iter11 != this->definition_level_histogram.end(); ++_iter11)
      {
        xfer += oprot->writeI64((*_iter11));
      }
      xfer += oprot->writeListEnd();
    }
    xfer += oprot->writeFieldEnd();
  }
  xfer += oprot->writeFieldStop();
  xfer += oprot->writeStructEnd();
  return xfer;
}